

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O2

void __thiscall
tvm::runtime::WorkspacePool::Pool::Release(Pool *this,TVMContext ctx,DeviceAPI *device)

{
  pointer pEVar1;
  pointer pEVar2;
  ostream *poVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  LogCheckError _check_err;
  int local_1b4;
  LogMessageFatal local_1b0;
  
  local_1b0._0_8_ =
       (long)(this->allocated_).
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->allocated_).
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_1b4 = 1;
  dmlc::LogCheck_EQ<unsigned_long,int>((dmlc *)&_check_err,(unsigned_long *)&local_1b0,&local_1b4);
  if (_check_err.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/workspace_pool.cc"
               ,0x77);
    poVar3 = std::operator<<((ostream *)&local_1b0,"Check failed: ");
    poVar3 = std::operator<<(poVar3,"allocated_.size() == 1");
    poVar3 = std::operator<<(poVar3,(string *)_check_err.str);
    std::operator<<(poVar3,": ");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  dmlc::LogCheckError::~LogCheckError(&_check_err);
  uVar4 = 1;
  lVar5 = 0x10;
  while( true ) {
    pEVar1 = (this->free_list_).
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar2 = (this->free_list_).
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pEVar2 - (long)pEVar1 >> 4) <= uVar4) break;
    (*device->_vptr_DeviceAPI[5])(device,ctx,*(undefined8 *)((long)&pEVar1->data + lVar5));
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x10;
  }
  if (pEVar2 != pEVar1) {
    (this->free_list_).
    super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar1;
  }
  return;
}

Assistant:

void Release(TVMContext ctx, DeviceAPI *device) {
    CHECK_EQ(allocated_.size(), 1);
    for (size_t i = 1; i < free_list_.size(); ++i) {
      device->FreeDataSpace(ctx, free_list_[i].data);
    }
    free_list_.clear();
  }